

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* httplib::make_basic_authentication_header
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *username,string *password,bool is_proxy)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  long *plVar4;
  size_type *psVar5;
  ulong *puVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_b0;
  ulong local_a0;
  long lStack_98;
  string local_90;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  string local_48;
  
  pcVar2 = (username->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar2,pcVar2 + username->_M_string_length);
  std::__cxx11::string::append((char *)local_68);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_68,(ulong)(password->_M_dataplus)._M_p);
  psVar5 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_48.field_2._M_allocated_capacity = *psVar5;
    local_48.field_2._8_8_ = plVar4[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar5;
    local_48._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_48._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  detail::base64_encode(&local_90,&local_48);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x12ee3e);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_a0 = *puVar6;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *puVar6;
    local_b0 = (ulong *)*plVar4;
  }
  sVar3 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  local_90._M_dataplus._M_p = "Authorization";
  if (is_proxy) {
    local_90._M_dataplus._M_p = "Proxy-Authorization";
  }
  puVar6 = (ulong *)((long)&local_90.field_2 + 8);
  if (local_b0 == &local_a0) {
    lStack_70 = lStack_98;
    local_90._M_string_length = (size_type)puVar6;
  }
  else {
    local_90._M_string_length = (size_type)local_b0;
  }
  local_90.field_2._8_8_ = local_a0;
  local_a0 = local_a0 & 0xffffffffffffff00;
  local_90.field_2._M_allocated_capacity = sVar3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_90._M_dataplus._M_p,(allocator<char> *)&local_48
            );
  paVar1 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
  if ((ulong *)local_90._M_string_length == puVar6) {
    paVar1->_M_allocated_capacity = local_90.field_2._8_8_;
    *(long *)((long)&(__return_storage_ptr__->second).field_2 + 8) = lStack_70;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)local_90._M_string_length;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_90.field_2._8_8_;
  }
  (__return_storage_ptr__->second)._M_string_length = local_90.field_2._M_allocated_capacity;
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<std::string, std::string>
	make_basic_authentication_header(const std::string &username,
									 const std::string &password,
									 bool is_proxy = false) {
		auto field = "Basic " + detail::base64_encode(username + ":" + password);
		auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
		return std::make_pair(key, std::move(field));
	}